

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

string * convert(char *from,char *to,char *_src,size_t size,string *out)

{
  byte bVar1;
  iconv_t __cd;
  size_t sVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  char *src;
  string *local_e8;
  char *local_e0;
  size_t dst_len;
  pointer local_d0;
  size_t src_len;
  char *dst;
  string orig_src;
  char to_ignore [100];
  
  local_e8 = out;
  local_e0 = to;
  if (size == 0) {
    std::__cxx11::string::assign((char *)out);
  }
  else {
    orig_src._M_dataplus._M_p = (pointer)&orig_src.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&orig_src,_src,_src + size);
    std::__cxx11::string::resize((ulong)out);
    local_d0 = (out->_M_dataplus)._M_p;
    sprintf(to_ignore,"%s//IGNORE",local_e0);
    __cd = iconv_open(to_ignore,from);
    if (__cd != (iconv_t)0xffffffffffffffff) {
      iVar6 = 100;
LAB_0015fde6:
      bVar7 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar7) {
        std::__cxx11::string::resize((ulong)local_e8);
      }
      else {
        src = orig_src._M_dataplus._M_p;
        dst = local_d0;
        dst_len = size * 2 + 10;
        src_len = size;
        sVar2 = iconv(__cd,&src,&src_len,&dst,&dst_len);
        if ((sVar2 == 0xffffffffffffffff) &&
           ((ulong)((long)src - (long)orig_src._M_dataplus._M_p) < size)) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"iconv failed: ");
          poVar3 = std::operator<<(poVar3,from);
          poVar3 = std::operator<<(poVar3,",");
          poVar3 = std::operator<<(poVar3,local_e0);
          poVar3 = std::operator<<(poVar3,":");
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          poVar3 = std::operator<<(poVar3,pcVar5);
          poVar3 = std::operator<<(poVar3,"at ");
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::endl<char,std::char_traits<char>>(poVar3);
          pcVar5 = src;
          if (src + (2 - (long)orig_src._M_dataplus._M_p) < size) goto code_r0x0015feec;
          goto LAB_0015ff00;
        }
        iconv_close(__cd);
        std::__cxx11::string::resize((ulong)local_e8);
      }
      goto LAB_0015ff99;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"iconv_open error: ");
    poVar3 = std::operator<<(poVar3,from);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = std::operator<<(poVar3,local_e0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::assign((char *)local_e8);
LAB_0015ff99:
    std::__cxx11::string::~string((string *)&orig_src);
  }
  return local_e8;
code_r0x0015feec:
  bVar1 = *src;
  *src = ' ';
  if (0x80 < bVar1) {
    pcVar5 = src + 1;
LAB_0015ff00:
    *pcVar5 = ' ';
  }
  goto LAB_0015fde6;
}

Assistant:

static std::string& convert(const char* from, const char* to, const char* _src, size_t size, std::string* out)
{
    // std::cout<<"convert " << from <<"," << to << "," << size << std::endl;
    if (size == 0 ) {
        *out = "";
        return *out;
    }

    std::string orig_src(_src, size);

    size_t buf_len = size*2 + 10;
    out->resize(buf_len);

    char* out_buf = (char*)out->data();

    char to_ignore[100];
    // char from_ignore[100];
    sprintf(to_ignore, "%s//IGNORE", to);
    iconv_t ic = iconv_open(to_ignore, from);
    // iconv_t ic = iconv_open(to, from);

    if ((size_t)ic == -1) {
        std::cerr << "iconv_open error: " << from << " -> " << to << std::endl;
        *out = "";
        return *out;
    }


    //while (true) {
    for (int i = 0; i < 100; i++) { // max try 100
        char* src = (char*)orig_src.data();
        char* dst = out_buf;
        size_t dst_len = buf_len;
        size_t src_len = size;

        size_t ret = iconv(ic, (char**)&src, &src_len, &dst, &dst_len);
        if ( (ret == (size_t)-1) && (src - orig_src.data() < size) ) {
            std::cerr << "iconv failed: " << from << "," << to << ":" << strerror(errno)
                << "at " << (src - orig_src.data()) << std::endl;

            if (src - orig_src.data() + 2 < size) {
                if ((uint8_t)src[0] > 0x80 ) {
                    src[0] = ' ';
                    src[1] = ' ';
                }
                else {
                    src[0] = ' ';
                }
            } else {
                src[0] = ' ';
            }
            continue;
        } else {
            iconv_close(ic);
            out->resize(buf_len - dst_len);            
            return *out;
        }
    }
    out->resize(0);
    return *out;
}